

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O2

REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  uint n;
  uint uVar1;
  int iVar2;
  long lVar3;
  REF_MPI pRVar4;
  long lVar5;
  void *__ptr;
  ulong uVar6;
  FILE *pFVar7;
  ulong uVar8;
  void *pvVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  uint local_74;
  REF_INT nterm;
  REF_INT local;
  REF_INT file_nnode;
  ulong local_58;
  FILE *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  ref_node = ref_grid->node;
  lVar3 = ref_node->old_n_global / 2;
  pRVar4 = ref_grid->mpi;
  if (pRVar4->id == 0) {
    pFVar7 = fopen(filename,"r");
    if (pFVar7 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar12 = "unable to open file";
      uVar10 = 0x8c9;
      goto LAB_00185dd3;
    }
    iVar2 = __isoc99_fscanf(pFVar7,"%d %d",&file_nnode,&nterm);
    if (iVar2 != 2) {
      lVar11 = (long)iVar2;
      pcVar12 = "read header";
      lVar3 = 2;
      uVar10 = 0x8ca;
      goto LAB_00185ece;
    }
    lVar11 = (long)file_nnode;
    if (lVar3 != lVar11) {
      pcVar12 = "wrong node count";
      uVar10 = 0x8cb;
      goto LAB_00185ece;
    }
    lVar11 = (long)nterm;
    if (lVar11 != 3) {
      pcVar12 = "expected 3 term 2x2 anisotropic M";
      lVar3 = 3;
      uVar10 = 0x8cc;
      goto LAB_00185ece;
    }
    pRVar4 = ref_grid->mpi;
  }
  else {
    pFVar7 = (FILE *)0x0;
  }
  lVar5 = lVar3 / (long)pRVar4->n;
  lVar11 = (long)(int)lVar5;
  if (lVar5 < 100000) {
    lVar11 = 100000;
  }
  if (lVar3 <= lVar11) {
    lVar11 = lVar3;
  }
  uVar1 = (uint)lVar11;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8d2,
           "ref_part_bamg_metric","malloc metric of REF_DBL negative");
    return 1;
  }
  n = uVar1 * 3;
  local_50 = pFVar7;
  __ptr = malloc((ulong)n << 3);
  if (__ptr != (void *)0x0) {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)n) {
      uVar8 = (ulong)n;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined8 *)((long)__ptr + uVar6 * 8) = 0xbff0000000000000;
    }
    local_40 = (ulong)(uVar1 & 0x7fffffff);
    local_74 = 1;
    lVar11 = 0;
    local_38 = lVar3;
    while (lVar11 < local_38) {
      local_58 = ref_node->old_n_global - lVar11;
      if ((long)local_40 < (long)local_58) {
        local_58 = local_40;
      }
      local_48 = lVar11;
      if (ref_grid->mpi->id == 0) {
        uVar6 = 0;
        if (0 < (int)local_58) {
          uVar6 = local_58 & 0xffffffff;
        }
        lVar3 = uVar6 + 1;
        pvVar9 = __ptr;
        while (lVar11 = local_48, lVar3 = lVar3 + -1, lVar3 != 0) {
          iVar2 = __isoc99_fscanf(local_50,"%lf %lf %lf",pvVar9,(long)pvVar9 + 8,(long)pvVar9 + 0x10
                                 );
          pvVar9 = (void *)((long)pvVar9 + 0x18);
          if (iVar2 != 3) {
            lVar11 = (long)iVar2;
            pcVar12 = "metric read error";
            lVar3 = 3;
            uVar10 = 0x8dd;
            goto LAB_00185ece;
          }
        }
        uVar1 = ref_mpi_bcast(ref_grid->mpi,__ptr,n,3);
        if (uVar1 != 0) {
          uVar6 = (ulong)uVar1;
          pcVar12 = "bcast";
          uVar10 = 0x8e1;
          goto LAB_00185e35;
        }
      }
      else {
        uVar1 = ref_mpi_bcast(ref_grid->mpi,__ptr,n,3);
        if (uVar1 != 0) {
          uVar6 = (ulong)uVar1;
          pcVar12 = "bcast";
          uVar10 = 0x8e5;
LAB_00185e35:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar10,"ref_part_bamg_metric",uVar6,pcVar12);
          return (REF_STATUS)uVar6;
        }
        uVar6 = 0;
        if (0 < (int)local_58) {
          uVar6 = local_58 & 0xffffffff;
        }
      }
      for (lVar3 = 0; uVar6 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
        uVar1 = ref_node_local(ref_node,lVar11,&local);
        if ((uVar1 != 0) && (uVar1 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x8e9,"ref_part_bamg_metric",(ulong)uVar1,"local");
          local_74 = uVar1;
        }
        if ((uVar1 != 5) && (uVar1 != 0)) {
          return local_74;
        }
        if ((local != -1) &&
           (uVar1 = ref_node_metric_form
                              (ref_node,local,*(REF_DBL *)((long)__ptr + lVar3),
                               *(REF_DBL *)((long)__ptr + lVar3 + 8),0.0,
                               *(REF_DBL *)((long)__ptr + lVar3 + 0x10),0.0,1.0), uVar1 != 0)) {
          uVar6 = (ulong)uVar1;
          pcVar12 = "set local node met";
          uVar10 = 0x8ee;
          goto LAB_00185e35;
        }
        lVar11 = lVar11 + 1;
      }
      lVar11 = local_48 + (int)local_58;
    }
    free(__ptr);
    if (ref_grid->mpi->id != 0) {
      return 0;
    }
    iVar2 = fclose(local_50);
    if (iVar2 == 0) {
      return 0;
    }
    lVar11 = (long)iVar2;
    pcVar12 = "close file";
    uVar10 = 0x8f5;
    lVar3 = 0;
LAB_00185ece:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar10,
           "ref_part_bamg_metric",pcVar12,lVar3,lVar11);
    return 1;
  }
  pcVar12 = "malloc metric of REF_DBL NULL";
  uVar10 = 0x8d2;
LAB_00185dd3:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar10,
         "ref_part_bamg_metric",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT file_nnode, section_size;
  REF_GLOB nnode, nnode_read, global;
  REF_INT node, local;
  REF_INT nterm;

  nnode = ref_node_n_global(ref_node) / 2;

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    REIS(2, fscanf(file, "%d %d", &file_nnode, &nterm), "read header");
    REIS(nnode, file_nnode, "wrong node count");
    REIS(3, nterm, "expected 3 term 2x2 anisotropic M");
  }

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_grid_mpi(ref_grid)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 3 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_grid_once(ref_grid)) {
      for (node = 0; node < section_size; node++) {
        REIS(3,
             fscanf(file, "%lf %lf %lf", &(metric[0 + 3 * node]),
                    &(metric[1 + 3 * node]), &(metric[2 + 3 * node])),
             "metric read error");
      }
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_form(ref_node, local, metric[0 + 3 * node],
                                 metric[1 + 3 * node], 0, metric[2 + 3 * node],
                                 0, 1),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}